

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyTests.cpp
# Opt level: O1

void __thiscall IsNotEmptyTests::Run(IsNotEmptyTests *this)

{
  undefined8 local_198;
  undefined8 uStack_190;
  code *local_188;
  code *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  code *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"an empty string is empty","");
  local_f8 = 0;
  uStack_f0 = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:51:36)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:51:36)>
             ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_38);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"an empty vector is empty","");
  local_118 = 0;
  uStack_110 = 0;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:55:36)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:55:36)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_58);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"a string with content is not empty","");
  local_138 = 0;
  uStack_130 = 0;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:59:46)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:59:46)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_78);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"a vector with content is not empty","");
  local_158 = 0;
  uStack_150 = 0;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:63:46)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:63:46)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_98);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Is::Empty is an operand","");
  local_178 = 0;
  uStack_170 = 0;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:67:35)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:67:35)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_b8);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Is::Empty has an error message","");
  local_198 = 0;
  uStack_190 = 0;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:71:42)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/EmptyTests.cpp:71:42)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_d8);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return;
}

Assistant:

virtual void Run()
	{
		Then("an empty string is empty", []() {
			AssertThat(ut11::Is::Not::Empty(""), ut11::Is::False);
			AssertThat(ut11::Is::Not::Empty(std::string("")), ut11::Is::False);
		});
		Then("an empty vector is empty", []() {
			AssertThat(ut11::Is::Not::Empty(std::vector<int>()), ut11::Is::False);
		});

		Then("a string with content is not empty", []() {
			AssertThat(ut11::Is::Not::Empty("String With Content"), ut11::Is::True);
			AssertThat(ut11::Is::Not::Empty(std::string("String With Content")), ut11::Is::True);
		});
		Then("a vector with content is not empty", []() {
			AssertThat(ut11::Is::Not::Empty(std::vector<int>({1,2,3})), ut11::Is::True);
		});

		Then("Is::Empty is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Empty) >::value, ut11::Is::True);
		});

		Then("Is::Empty has an error message", []() {
			AssertThat(ut11::Is::Not::Empty.GetErrorMessage(""), ut11::Is::Not::EqualTo(""));
		});
	}